

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  QHttpNetworkHeaderPrivate *in_RSI;
  QHttpNetworkHeaderPrivate *in_RDI;
  
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate(in_RSI,in_RDI);
  in_RDI[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       in_RSI[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i;
  QByteArray::QByteArray((QByteArray *)in_RSI,(QByteArray *)in_RDI);
  QString::QString((QString *)in_RSI,(QString *)in_RDI);
  in_RDI[1].parser.minorVersion = in_RSI[1].parser.minorVersion;
  in_RDI[1].parser.maxFieldSize = in_RSI[1].parser.maxFieldSize;
  *(byte *)&in_RDI[1].parser.maxTotalSize = (byte)in_RSI[1].parser.maxTotalSize & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 1) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 1) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 2) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 2) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 3) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 3) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 4) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 4) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 5) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 5) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 6) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 6) & 1;
  *(byte *)((long)&in_RDI[1].parser.maxTotalSize + 7) =
       *(byte *)((long)&in_RSI[1].parser.maxTotalSize + 7) & 1;
  *(byte *)&in_RDI[1].parser.maxFieldCount = (byte)in_RSI[1].parser.maxFieldCount & 1;
  *(undefined4 *)((long)&in_RDI[1].parser.maxFieldCount + 4) =
       *(undefined4 *)((long)&in_RSI[1].parser.maxFieldCount + 4);
  in_RDI[2].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       in_RSI[2].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i;
  QString::QString((QString *)in_RSI,(QString *)in_RDI);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(const QHttpNetworkRequestPrivate &other) // = default
    : QHttpNetworkHeaderPrivate(other),
      operation(other.operation),
      customVerb(other.customVerb),
      fullLocalServerName(other.fullLocalServerName),
      priority(other.priority),
      uploadByteDevice(other.uploadByteDevice),
      autoDecompress(other.autoDecompress),
      pipeliningAllowed(other.pipeliningAllowed),
      http2Allowed(other.http2Allowed),
      http2Direct(other.http2Direct),
      h2cAllowed(other.h2cAllowed),
      withCredentials(other.withCredentials),
      ssl(other.ssl),
      preConnect(other.preConnect),
      needResendWithCredentials(other.needResendWithCredentials),
      redirectCount(other.redirectCount),
      redirectPolicy(other.redirectPolicy),
      peerVerifyName(other.peerVerifyName)
{
}